

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalCommonGenerator::cmLocalCommonGenerator
          (cmLocalCommonGenerator *this,cmGlobalGenerator *gg,cmMakefile *mf,string *wd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmMakefile *this_00;
  char *pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  char *__s;
  string local_50;
  
  cmLocalGenerator::cmLocalGenerator(&this->super_cmLocalGenerator,gg,mf);
  (this->super_cmLocalGenerator)._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalCommonGenerator_00634928;
  paVar2 = &(this->WorkingDirectory).field_2;
  (this->WorkingDirectory)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (wd->_M_dataplus)._M_p;
  paVar1 = &wd->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar5 = *(undefined4 *)((long)&wd->field_2 + 4);
    uVar6 = *(undefined4 *)((long)&wd->field_2 + 8);
    uVar7 = *(undefined4 *)((long)&wd->field_2 + 0xc);
    *(undefined4 *)paVar2 = *(undefined4 *)paVar1;
    *(undefined4 *)((long)&(this->WorkingDirectory).field_2 + 4) = uVar5;
    *(undefined4 *)((long)&(this->WorkingDirectory).field_2 + 8) = uVar6;
    *(undefined4 *)((long)&(this->WorkingDirectory).field_2 + 0xc) = uVar7;
  }
  else {
    (this->WorkingDirectory)._M_dataplus._M_p = pcVar3;
    (this->WorkingDirectory).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->WorkingDirectory)._M_string_length = wd->_M_string_length;
  (wd->_M_dataplus)._M_p = (pointer)paVar1;
  wd->_M_string_length = 0;
  (wd->field_2)._M_local_buf[0] = '\0';
  (this->ConfigName)._M_dataplus._M_p = (pointer)&(this->ConfigName).field_2;
  (this->ConfigName)._M_string_length = 0;
  (this->ConfigName).field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmLocalGenerator).Makefile;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_BUILD_TYPE","");
  __s = cmMakefile::GetDefinition(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (__s == (char *)0x0) {
    (this->ConfigName)._M_string_length = 0;
    *(this->ConfigName)._M_dataplus._M_p = '\0';
  }
  else {
    pcVar4 = (char *)(this->ConfigName)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&this->ConfigName,0,pcVar4,(ulong)__s);
  }
  return;
}

Assistant:

cmLocalCommonGenerator::cmLocalCommonGenerator(cmGlobalGenerator* gg,
                                               cmMakefile* mf, std::string wd)
  : cmLocalGenerator(gg, mf)
  , WorkingDirectory(std::move(wd))
{
  // Store the configuration name that will be generated.
  if (const char* config = this->Makefile->GetDefinition("CMAKE_BUILD_TYPE")) {
    // Use the build type given by the user.
    this->ConfigName = config;
  } else {
    // No configuration type given.
    this->ConfigName.clear();
  }
}